

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O1

void onig_st_free_table(st_table *table)

{
  st_table_entry *psVar1;
  st_table_entry *__ptr;
  long lVar2;
  
  if (0 < table->num_bins) {
    lVar2 = 0;
    do {
      __ptr = table->bins[lVar2];
      while (__ptr != (st_table_entry *)0x0) {
        psVar1 = __ptr->next;
        free(__ptr);
        __ptr = psVar1;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < table->num_bins);
  }
  free(table->bins);
  free(table);
  return;
}

Assistant:

extern void
st_free_table(st_table* table)
{
  register st_table_entry *ptr, *next;
  int i;

  for(i = 0; i < table->num_bins; i++) {
    ptr = table->bins[i];
    while (ptr != 0) {
	    next = ptr->next;
	    free(ptr);
	    ptr = next;
    }
  }
  free(table->bins);
  free(table);
}